

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O0

Bits ValueType::BitPattern(TSize onCount)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  TSize onCount_local;
  
  if ((onCount == 0) || (0x10 < onCount)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/ValueType.cpp"
                       ,0x1a,"(onCount && onCount <= sizeof(TSize) * 8)",
                       "onCount && onCount <= sizeof(TSize) * 8");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return (short)(1L << ((byte)onCount & 0x3f)) - Likely;
}

Assistant:

inline ValueType::Bits ValueType::BitPattern(const TSize onCount)
{
    CompileAssert(sizeof(TSize) <= sizeof(size_t));
    Assert(onCount && onCount <= sizeof(TSize) * 8);

#pragma prefast(suppress:6235, "Non-Zero Constant TSize and size_t in Condition. This is By Design to allow for TSize to be increased in size to uint32 without breaking anything")
    return
        static_cast<Bits>(
            sizeof(TSize) < sizeof(size_t) || onCount < sizeof(TSize) * 8
                ? (static_cast<size_t>(1) << onCount) - 1
                : static_cast<size_t>(-1));
}